

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O2

_Bool is_frame_aq_enabled(AV1_COMP *cpi)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
      ((cpi->common).features.error_resilient_mode == false)) &&
     ((cpi->refresh_frame).alt_ref_frame == false)) {
    if ((cpi->refresh_frame).golden_frame != true) {
      return false;
    }
    _Var1 = (cpi->rc).is_src_frame_alt_ref == 0;
  }
  return _Var1;
}

Assistant:

static bool is_frame_aq_enabled(const AV1_COMP *const cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;

  return frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
         refresh_frame->alt_ref_frame ||
         (refresh_frame->golden_frame && !cpi->rc.is_src_frame_alt_ref);
}